

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::memory<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  Limits limits;
  Name name_00;
  bool bVar1;
  size_t sVar2;
  Name *pNVar3;
  Err *pEVar4;
  MemType *pMVar5;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_00;
  ImportNames *import_00;
  vector<char,_std::allocator<char>_> *pvVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  Ok local_4f1;
  Err local_4f0;
  Err *local_4d0;
  Err *err_5;
  Result<wasm::Ok> _val_5;
  Err *err_4;
  undefined1 local_438 [8];
  Result<wasm::Ok> _val_4;
  string local_408;
  Err local_3e8;
  Err local_3c8;
  Err *local_3a8;
  Err *err_3;
  Result<wasm::WATParser::MemType> _val_3;
  undefined1 local_368 [8];
  Result<wasm::WATParser::MemType> type;
  undefined8 uStack_330;
  undefined8 local_328;
  Type local_320;
  MemType local_318;
  allocator<char> local_2e9;
  string local_2e8;
  Err local_2c8;
  Err local_2a8;
  Err *local_288;
  Err *err_2;
  Result<std::vector<char,_std::allocator<char>_>_> _val_2;
  Result<std::vector<char,_std::allocator<char>_>_> datastr;
  string local_228;
  Err local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  undefined1 local_1d8 [8];
  optional<std::vector<char,_std::allocator<char>_>_> data;
  optional<wasm::WATParser::MemType> mtype;
  BasicType local_164;
  undefined1 local_160 [4];
  BasicType addressType;
  Err *local_140;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  bVar7 = sv("memory",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar7);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&exports.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar3 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar3);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                __return_storage_ptr___00,&ctx->in);
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             __return_storage_ptr___00);
  local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                       ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  bVar1 = local_c0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  if (bVar1) goto LAB_0232be3f;
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),&ctx->in);
  MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
             (MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
  local_140 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                        ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  bVar1 = local_140 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err((Err *)local_160,local_140);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_160);
    wasm::Err::~Err((Err *)local_160);
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  if (bVar1) {
    local_164 = i32;
    bVar7 = sv("i64",3);
    bVar1 = Lexer::takeKeyword(&ctx->in,bVar7);
    if (bVar1) {
      local_164 = i64;
    }
    else {
      bVar7 = sv("i32",3);
      Lexer::takeKeyword(&ctx->in,bVar7);
    }
    std::optional<wasm::WATParser::MemType>::optional
              ((optional<wasm::WATParser::MemType> *)
               &data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                .super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._M_engaged)
    ;
    std::optional<std::vector<char,_std::allocator<char>_>_>::optional
              ((optional<std::vector<char,_std::allocator<char>_>_> *)local_1d8);
    local_1e8 = sv("data",4);
    bVar1 = Lexer::takeSExprStart(&ctx->in,local_1e8);
    if (bVar1) {
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_1.val.
                                 super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         + 0x20));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"imported memories cannot have inline data",
                   (allocator<char> *)
                   ((long)&datastr.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x27));
        Lexer::err(&local_208,&ctx->in,&local_228);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_208);
        wasm::Err::~Err(&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&datastr.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x27));
      }
      else {
        datastring<wasm::WATParser::ParseDeclsCtx>
                  ((Result<std::vector<char,_std::allocator<char>_>_> *)
                   ((long)&_val_2.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),ctx);
        Result<std::vector<char,_std::allocator<char>_>_>::Result
                  ((Result<std::vector<char,_std::allocator<char>_>_> *)&err_2,
                   (Result<std::vector<char,_std::allocator<char>_>_> *)
                   ((long)&_val_2.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        local_288 = Result<std::vector<char,_std::allocator<char>_>_>::getErr
                              ((Result<std::vector<char,_std::allocator<char>_>_> *)&err_2);
        bVar1 = local_288 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_2a8,local_288);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2a8);
          wasm::Err::~Err(&local_2a8);
        }
        Result<std::vector<char,_std::allocator<char>_>_>::~Result
                  ((Result<std::vector<char,_std::allocator<char>_>_> *)&err_2);
        if (!bVar1) {
          bVar1 = Lexer::takeRParen(&ctx->in);
          if (bVar1) {
            wasm::Type::Type(&local_320,local_164);
            pvVar6 = Result<std::vector<char,_std::allocator<char>_>_>::operator*
                               ((Result<std::vector<char,_std::allocator<char>_>_> *)
                                ((long)&_val_2.val.
                                        super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                        .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20)
                               );
            ParseDeclsCtx::getLimitsFromData
                      ((Limits *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err> + 0x28),
                       ctx,pvVar6);
            limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload =
                 (_Storage<unsigned_long,_true>)uStack_330;
            limits.initial =
                 type.val.super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::MemType,_wasm::Err>._40_8_;
            limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_ = local_328;
            ParseDeclsCtx::makeMemType(&local_318,ctx,local_320,limits,false);
            std::optional<wasm::WATParser::MemType>::operator=
                      ((optional<wasm::WATParser::MemType> *)
                       &data.
                        super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                        .super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>.
                        _M_engaged,&local_318);
            pvVar6 = Result<std::vector<char,_std::allocator<char>_>_>::operator*
                               ((Result<std::vector<char,_std::allocator<char>_>_> *)
                                ((long)&_val_2.val.
                                        super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                        .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20)
                               );
            std::optional<std::vector<char,std::allocator<char>>>::operator=
                      ((optional<std::vector<char,std::allocator<char>>> *)local_1d8,pvVar6);
            bVar1 = false;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e8,"expected end of inline data",&local_2e9);
            Lexer::err(&local_2c8,&ctx->in,&local_2e8);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2c8);
            wasm::Err::~Err(&local_2c8);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::allocator<char>::~allocator(&local_2e9);
            bVar1 = true;
          }
        }
        Result<std::vector<char,_std::allocator<char>_>_>::~Result
                  ((Result<std::vector<char,_std::allocator<char>_>_> *)
                   ((long)&_val_2.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        if (!bVar1) goto LAB_0232ba2a;
      }
    }
    else {
      wasm::Type::Type((Type *)((long)&_val_3.val.
                                       super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err> +
                               0x28),local_164);
      memtypeContinued<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::WATParser::MemType> *)local_368,ctx,
                 (Type)_val_3.val.super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::MemType,_wasm::Err>._40_8_);
      Result<wasm::WATParser::MemType>::Result
                ((Result<wasm::WATParser::MemType> *)&err_3,
                 (Result<wasm::WATParser::MemType> *)local_368);
      pEVar4 = Result<wasm::WATParser::MemType>::getErr((Result<wasm::WATParser::MemType> *)&err_3);
      local_3a8 = pEVar4;
      if (pEVar4 != (Err *)0x0) {
        wasm::Err::Err(&local_3c8,pEVar4);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3c8);
        wasm::Err::~Err(&local_3c8);
      }
      Result<wasm::WATParser::MemType>::~Result((Result<wasm::WATParser::MemType> *)&err_3);
      if (pEVar4 == (Err *)0x0) {
        pMVar5 = Result<wasm::WATParser::MemType>::operator*
                           ((Result<wasm::WATParser::MemType> *)local_368);
        std::optional<wasm::WATParser::MemType>::operator=
                  ((optional<wasm::WATParser::MemType> *)
                   &data.
                    super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                    .super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>.
                    _M_engaged,pMVar5);
      }
      Result<wasm::WATParser::MemType>::~Result((Result<wasm::WATParser::MemType> *)local_368);
      if (pEVar4 == (Err *)0x0) {
LAB_0232ba2a:
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          exports_00 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                                 ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                                  ((long)&_val.val.
                                          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                          .
                                          super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>
                                  + 0x20));
          import_00 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                                ((MaybeResult<wasm::WATParser::ImportNames> *)
                                 ((long)&_val_1.val.
                                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 + 0x20));
          pMVar5 = std::optional<wasm::WATParser::MemType>::operator*
                             ((optional<wasm::WATParser::MemType> *)
                              &data.
                               super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>
                               ._M_engaged);
          local_20 = (Index)sVar2;
          name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
          name_00.super_IString.str._M_len =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          ParseDeclsCtx::addMemory
                    ((Result<wasm::Ok> *)local_438,ctx,name_00,exports_00,import_00,*pMVar5,local_20
                    );
          pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_438);
          if (pEVar4 != (Err *)0x0) {
            wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4
                          );
            MaybeResult<wasm::Ok>::MaybeResult
                      (__return_storage_ptr__,
                       (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_438);
          if (pEVar4 == (Err *)0x0) {
            bVar1 = std::optional::operator_cast_to_bool((optional *)local_1d8);
            if (bVar1) {
              pvVar6 = std::optional<std::vector<char,_std::allocator<char>_>_>::operator*
                                 ((optional<std::vector<char,_std::allocator<char>_>_> *)local_1d8);
              ParseDeclsCtx::addImplicitData((Result<wasm::Ok> *)&err_5,ctx,pvVar6);
              local_4d0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_5);
              bVar1 = local_4d0 != (Err *)0x0;
              if (bVar1) {
                wasm::Err::Err(&local_4f0,local_4d0);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4f0);
                wasm::Err::~Err(&local_4f0);
              }
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_5);
              if (bVar1) goto LAB_0232be07;
            }
            MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_4f1);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"expected end of memory declaration",
                     (allocator<char> *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
          Lexer::err(&local_3e8,&ctx->in,&local_408);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3e8);
          wasm::Err::~Err(&local_3e8);
          std::__cxx11::string::~string((string *)&local_408);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        }
      }
    }
LAB_0232be07:
    std::optional<std::vector<char,_std::allocator<char>_>_>::~optional
              ((optional<std::vector<char,_std::allocator<char>_>_> *)local_1d8);
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
LAB_0232be3f:
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype =
      ctx.makeMemType(addressType, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtypeContinued(ctx, addressType);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}